

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_TruthPrecompute2(void)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  word *pwVar4;
  ulong uVar5;
  
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    uVar5 = 0xe8;
    pwVar4 = s_Truths6;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      if ((uVar3 >> ((uint)lVar1 & 0x1f) & 1) != 0) {
        bVar2 = (byte)(1 << ((byte)lVar1 & 0x1f));
        uVar5 = (*pwVar4 & uVar5) >> (bVar2 & 0x3f) | uVar5 << (bVar2 & 0x3f) & *pwVar4;
      }
      pwVar4 = pwVar4 + 1;
    }
    printf("%d = %X\n",(ulong)uVar3,uVar5 & 0xff);
  }
  return;
}

Assistant:

void Ree_TruthPrecompute2()
{
    int i, b;
    for ( i = 0; i < 8; i++ )
    {
        word Truth = 0xE8;
        for ( b = 0; b < 3; b++ )
            if ( (i >> b) & 1 )
                Truth = Abc_Tt6Flip( Truth, b );
        printf( "%d = %X\n", i, 0xFF & (int)Truth );
    }
}